

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

void anurbs::Model::register_python_data_type<anurbs::BrepEdge>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  PythonDataTypeBase<anurbs::Model> *pPVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  pointer *__ptr;
  arg local_68;
  _func_Ref<anurbs::BrepEdge>_Model_ptr_shared_ptr<anurbs::BrepEdge>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_58;
  key_type local_50;
  
  TypeRegistry<anurbs::Model>::register_type<anurbs::BrepEdge>(false);
  Ref<anurbs::BrepEdge>::register_python(m);
  new_<anurbs::PythonDataType<anurbs::Model,anurbs::BrepEdge>>();
  BrepEdge::type_name_abi_cxx11_();
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&PythonDataTypeBase<anurbs::Model>::s_types_abi_cxx11_,&local_50);
  pcVar2 = local_68.name;
  local_68.name = (char *)0x0;
  pPVar1 = (pmVar3->_M_t).
           super___uniq_ptr_impl<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_anurbs::PythonDataTypeBase<anurbs::Model>_*,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>
           .super__Head_base<0UL,_anurbs::PythonDataTypeBase<anurbs::Model>_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_anurbs::PythonDataTypeBase<anurbs::Model>_*,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>
  .super__Head_base<0UL,_anurbs::PythonDataTypeBase<anurbs::Model>_*,_false>._M_head_impl =
       (PythonDataTypeBase<anurbs::Model> *)pcVar2;
  if (pPVar1 != (PythonDataTypeBase<anurbs::Model> *)0x0) {
    (*pPVar1->_vptr_PythonDataTypeBase[1])();
  }
  std::__cxx11::string::~string((string *)&local_50);
  if ((long *)local_68.name != (long *)0x0) {
    (**(code **)(*(long *)local_68.name + 8))();
  }
  local_68.name = (char *)PythonDataType<anurbs::Model,_anurbs::BrepEdge>::add;
  local_50._M_dataplus._M_p = "data";
  local_50._M_string_length._0_1_ = 2;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepEdge>(*)(anurbs::Model&,std::shared_ptr<anurbs::BrepEdge>),pybind11::arg>
            ((class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model,"add",
             (_func_Ref<anurbs::BrepEdge>_Model_ptr_shared_ptr<anurbs::BrepEdge> **)&local_68,
             (arg *)&local_50);
  local_58 = PythonDataType<anurbs::Model,_anurbs::BrepEdge>::add_with_attributes;
  local_50._M_dataplus._M_p = "data";
  local_50._M_string_length._0_1_ = 2;
  local_68.name = "attributes";
  local_68._8_1_ = 2;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepEdge>(*)(anurbs::Model&,std::shared_ptr<anurbs::BrepEdge>,std::__cxx11::string_const&),pybind11::arg,pybind11::arg>
            ((class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model,"add",&local_58,
             (arg *)&local_50,&local_68);
  local_58 = PythonDataType<anurbs::Model,_anurbs::BrepEdge>::add_with_key;
  local_50._M_dataplus._M_p = "key";
  local_50._M_string_length._0_1_ = 2;
  local_68.name = "data";
  local_68._8_1_ = 2;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepEdge>(*)(anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::BrepEdge>),pybind11::arg,pybind11::arg>
            ((class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model,"add",
             (_func_Ref<anurbs::BrepEdge>_Model_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_shared_ptr<anurbs::BrepEdge>
              **)&local_58,(arg *)&local_50,&local_68);
  local_50._M_dataplus._M_p = "ref";
  local_50._M_string_length._0_1_ = 2;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Model::register_python_data_type<anurbs::BrepEdge>(pybind11::module&,pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>&)::_lambda(anurbs::Model&,anurbs::Ref<anurbs::BrepEdge>const&)_1_,pybind11::arg>
            ((class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model,"add",(type *)&local_68,
             (arg *)&local_50);
  local_58 = PythonDataType<anurbs::Model,_anurbs::BrepEdge>::replace;
  local_50._M_dataplus._M_p = "index";
  local_50._M_string_length._0_1_ = 2;
  local_68.name = "data";
  local_68._8_1_ = 2;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepEdge>(*)(anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepEdge>),pybind11::arg,pybind11::arg>
            ((class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model,"replace",
             (_func_Ref<anurbs::BrepEdge>_Model_ptr_unsigned_long_shared_ptr<anurbs::BrepEdge> **)
             &local_58,(arg *)&local_50,&local_68);
  local_58 = PythonDataType<anurbs::Model,_anurbs::BrepEdge>::replace_with_key;
  local_50._M_dataplus._M_p = "key";
  local_50._M_string_length._0_1_ = 2;
  local_68.name = "data";
  local_68._8_1_ = 2;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepEdge>(*)(anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::BrepEdge>),pybind11::arg,pybind11::arg>
            ((class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model,"replace",
             (_func_Ref<anurbs::BrepEdge>_Model_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_shared_ptr<anurbs::BrepEdge>
              **)&local_58,(arg *)&local_50,&local_68);
  return;
}

Assistant:

static void register_python_data_type(pybind11::module& m,
        pybind11::class_<Model, Pointer<Model>>& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        Model::register_type<TData>();

        Ref<TData>::register_python(m);

        PythonDataTypeBase<Model>::s_types[TData::type_name()] =
            new_<PythonDataType<Model, TData>>();

        model.def("add", &PythonDataType<Model, TData>::add, "data"_a);

        model.def("add", &PythonDataType<Model, TData>::add_with_attributes,
            "data"_a, "attributes"_a);

        model.def("add", &PythonDataType<Model, TData>::add_with_key, "key"_a,
            "data"_a);

        model.def("add", [](anurbs::Model& self, const Ref<TData>& ref) {
            return PythonDataType<Model, TData>::add_with_key(self, ref.key(),
            ref.data()); }, "ref"_a);
        
        model.def("replace", &PythonDataType<Model, TData>::replace, "index"_a,
            "data"_a);

        model.def("replace", &PythonDataType<Model, TData>::replace_with_key,
            "key"_a, "data"_a);
    }